

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int findrec(int *a,int *b,int *c)

{
  double dVar1;
  int iVar2;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double dVar3;
  double dVar4;
  undefined1 local_48 [16];
  undefined8 local_30;
  
  dVar3 = (double)*a;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = (double)*b;
  local_48._12_4_ = in_XMM0_Dd;
  dVar4 = (double)*c;
  local_30 = 1.0;
  iVar2 = 0;
  while (192.0 < dVar3 + (double)local_48._0_8_ + dVar4) {
    iVar2 = iVar2 + 1;
    local_30 = local_30 + local_30;
    dVar3 = ceil(dVar3 * 0.5);
    dVar1 = ceil((double)local_48._0_8_ * 0.5);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar1;
    local_48._12_4_ = extraout_XMM0_Dd;
    dVar4 = ceil(dVar4 * 0.5);
  }
  *a = (int)((double)(int)dVar3 * local_30);
  *b = (int)((double)(int)(double)local_48._0_8_ * local_30);
  *c = (int)((double)(int)dVar4 * local_30);
  return iVar2;
}

Assistant:

int findrec(int *a, int *b, int *c) {
	int rec;
	double da,db,dc,mul;
	da = (double) *a;
	db = (double) *b;
	dc = (double) *c;
	rec = 0;
	mul = 1.;
	
	while (da + db + dc > (double) CUTOFF) {
		rec++;
		mul *= 2;
		da = ceil(da/2.);
		db = ceil(db/2.);
		dc = ceil(dc/2.);
	}
	*a = (int) da * mul;
	*b = (int) db * mul;
	*c = (int) dc * mul;
	
	return rec;
}